

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_file.cpp
# Opt level: O3

int callback_file_skip(output_file *out,int64_t off)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  output_file_callback *outc;
  ulong uVar4;
  
  if (off < 1) {
    return 0;
  }
  while( true ) {
    uVar4 = 0x7fffffff;
    if ((ulong)off < 0x7fffffff) {
      uVar4 = off;
    }
    iVar2 = (**(code **)&out[1].chunk_cnt)(out[1].cur_out_ptr,0,uVar4);
    if (iVar2 < 0) break;
    uVar3 = off - uVar4;
    bVar1 = off < (long)uVar4;
    off = uVar3;
    if (uVar3 == 0 || bVar1) {
      return 0;
    }
  }
  return iVar2;
}

Assistant:

static int callback_file_skip(struct output_file* out, int64_t off) {
  struct output_file_callback* outc = to_output_file_callback(out);
  int to_write;
  int ret;

  while (off > 0) {
    to_write = std::min(off, (int64_t)INT_MAX);
    ret = outc->write(outc->priv, nullptr, to_write);
    if (ret < 0) {
      return ret;
    }
    off -= to_write;
  }

  return 0;
}